

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

qsizetype QtPrivate::indexOf<QPersistentModelIndex,QModelIndex>
                    (QList<QPersistentModelIndex> *vector,QModelIndex *u,qsizetype from)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  long lVar5;
  QPersistentModelIndex *lhs;
  qsizetype qVar6;
  
  if (from < 0) {
    from = from + (vector->d).size;
    if (from < 1) {
      from = 0;
    }
  }
  uVar1 = (vector->d).size;
  if ((ulong)from < uVar1) {
    lhs = (vector->d).ptr + from;
    lVar2 = uVar1 * 8 + from * -8;
    lVar3 = 8 - (long)lhs;
    do {
      qVar6 = lVar3;
      lVar5 = lVar2;
      if (lVar5 == 0) goto LAB_0047fe98;
      bVar4 = ::comparesEqual(lhs,u);
      lhs = lhs + 1;
      lVar2 = lVar5 + -8;
      lVar3 = qVar6 + -8;
    } while (!bVar4);
    qVar6 = -((long)&(vector->d).ptr[-1].d + qVar6) >> 3;
LAB_0047fe98:
    if (lVar5 != 0) {
      return qVar6;
    }
  }
  return -1;
}

Assistant:

qsizetype indexOf(const QList<T> &vector, const U &u, qsizetype from) noexcept
{
    if (from < 0)
        from = qMax(from + vector.size(), qsizetype(0));
    if (from < vector.size()) {
        auto n = vector.begin() + from - 1;
        auto e = vector.end();
        while (++n != e)
            if (*n == u)
                return qsizetype(n - vector.begin());
    }
    return -1;
}